

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.H
# Opt level: O1

DeviceVector<amrex::BCRec> *
amrex::convertToDeviceVector<amrex::BCRec>
          (DeviceVector<amrex::BCRec> *__return_storage_ptr__,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *v)

{
  size_type a_capacity;
  ulong uVar1;
  
  uVar1 = (ulong)((int)((ulong)((long)(v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>)
                                      .
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
  ;
  __return_storage_ptr__->m_data = (pointer)0x0;
  __return_storage_ptr__->m_size = 0;
  __return_storage_ptr__->m_capacity = 0;
  a_capacity = 2;
  if (2 < uVar1) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar1);
  }
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::AllocateBuffer
            (__return_storage_ptr__,a_capacity);
  __return_storage_ptr__->m_size = uVar1;
  memcpy(__return_storage_ptr__->m_data,
         (v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
         super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
         super__Vector_impl_data._M_start,uVar1 * 0x18);
  return __return_storage_ptr__;
}

Assistant:

Gpu::DeviceVector<T>
    convertToDeviceVector ( Vector<T> v)
    {
        int ncomp = v.size();
        Gpu::DeviceVector<T> v_d(ncomp);
#ifdef AMREX_USE_GPU
        Gpu::htod_memcpy
#else
	std::memcpy
#endif
	  (v_d.data(), v.data(), sizeof(T)*ncomp);

        return v_d;
    }